

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O0

int * Llb_MtrFindVarOrder(Llb_Mtr_t *p)

{
  int iVar1;
  undefined4 uVar2;
  bool bVar3;
  int *piVar4;
  void *__ptr;
  int Temp;
  int fChanges;
  int k;
  int i;
  int *pLast;
  int *pOrder;
  Llb_Mtr_t *p_local;
  
  piVar4 = (int *)calloc((long)p->nRows,4);
  __ptr = calloc((long)p->nRows,4);
  fChanges = 0;
  do {
    if (p->nRows <= fChanges) {
      do {
        bVar3 = false;
        for (fChanges = 0; fChanges < p->nRows + -1; fChanges = fChanges + 1) {
          if (*(int *)((long)__ptr + (long)(fChanges + 1) * 4) <
              *(int *)((long)__ptr + (long)fChanges * 4)) {
            iVar1 = piVar4[fChanges];
            piVar4[fChanges] = piVar4[fChanges + 1];
            piVar4[fChanges + 1] = iVar1;
            uVar2 = *(undefined4 *)((long)__ptr + (long)fChanges * 4);
            *(undefined4 *)((long)__ptr + (long)fChanges * 4) =
                 *(undefined4 *)((long)__ptr + (long)(fChanges + 1) * 4);
            *(undefined4 *)((long)__ptr + (long)(fChanges + 1) * 4) = uVar2;
            bVar3 = true;
          }
        }
      } while (bVar3);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      return piVar4;
    }
    piVar4[fChanges] = fChanges;
    Temp = p->nCols;
    do {
      Temp = Temp + -1;
      if (Temp < 0) goto LAB_00a82235;
    } while (p->pMatrix[Temp][fChanges] == '\0');
    *(int *)((long)__ptr + (long)fChanges * 4) = Temp;
LAB_00a82235:
    fChanges = fChanges + 1;
  } while( true );
}

Assistant:

int * Llb_MtrFindVarOrder( Llb_Mtr_t * p )
{
    int * pOrder, * pLast;
    int i, k, fChanges, Temp;
    pOrder = ABC_CALLOC( int, p->nRows );
    pLast  = ABC_CALLOC( int, p->nRows );
    for ( i = 0; i < p->nRows; i++ )
    {
        pOrder[i] = i;
        for ( k = p->nCols - 1; k >= 0; k-- )
            if ( p->pMatrix[k][i] )
            {
                pLast[i] = k;
                break;
            }
    }
    do
    {
        fChanges = 0;
        for ( i = 0; i < p->nRows - 1; i++ )
            if ( pLast[i] > pLast[i+1] )
            {
                Temp = pOrder[i];
                pOrder[i] = pOrder[i+1];
                pOrder[i+1] = Temp;

                Temp = pLast[i];
                pLast[i] = pLast[i+1];
                pLast[i+1] = Temp;

                fChanges = 1;
            }
    }
    while ( fChanges );
    ABC_FREE( pLast );
    return pOrder;
}